

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O3

VP8LMultipliers
GetBestColorTransformForTile
          (int tile_x,int tile_y,int bits,VP8LMultipliers prev_x,VP8LMultipliers prev_y,int quality,
          int xsize,int ysize,uint32_t *accumulated_red_histo,uint32_t *accumulated_blue_histo,
          uint32_t *argb)

{
  uint32_t *argb_00;
  char cVar1;
  byte bVar2;
  uint uVar3;
  int64_t iVar4;
  int64_t iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  bool bVar16;
  byte local_40;
  
  bVar2 = (byte)bits;
  iVar11 = 1 << (bVar2 & 0x1f);
  iVar8 = tile_y << (bVar2 & 0x1f);
  iVar10 = tile_x << (bVar2 & 0x1f);
  iVar7 = iVar10 + iVar11;
  if (xsize <= iVar7) {
    iVar7 = xsize;
  }
  iVar11 = iVar11 + iVar8;
  if (ysize <= iVar11) {
    iVar11 = ysize;
  }
  iVar7 = iVar7 - iVar10;
  iVar11 = iVar11 - iVar8;
  argb_00 = argb + (long)(iVar8 * xsize) + (long)iVar10;
  iVar10 = quality * 7 >> 8;
  iVar4 = GetPredictionCostCrossColorRed
                    (argb_00,xsize,iVar7,iVar11,prev_x,prev_y,0,accumulated_red_histo);
  uVar15 = 0;
  iVar8 = 0;
  if (-4 < iVar10) {
    iVar8 = 0;
    iVar12 = 0;
    do {
      uVar3 = 0x20 >> ((byte)iVar12 & 0x1f);
      iVar13 = -uVar3;
      do {
        iVar5 = GetPredictionCostCrossColorRed
                          (argb_00,xsize,iVar7,iVar11,prev_x,prev_y,iVar8 + iVar13,
                           accumulated_red_histo);
        if (iVar5 < iVar4) {
          iVar4 = iVar5;
          iVar8 = iVar8 + iVar13;
        }
        iVar13 = iVar13 + uVar3 * 2;
      } while (iVar13 <= (int)uVar3);
      bVar16 = iVar12 != iVar10 + 3;
      iVar12 = iVar12 + 1;
    } while (bVar16);
  }
  iVar4 = GetPredictionCostCrossColorBlue
                    (argb_00,xsize,iVar7,iVar11,prev_x,prev_y,0,0,accumulated_blue_histo);
  uVar9 = 0;
  iVar10 = 0;
  while( true ) {
    cVar1 = (&DAT_001bdfe0)[uVar9];
    uVar14 = 0;
    do {
      uVar3 = (int)(char)(&DAT_001bdfd0)[uVar14 * 2] * (int)cVar1 + uVar15;
      iVar12 = (int)(char)(&DAT_001bdfd1)[uVar14 * 2] * (int)cVar1 + iVar10;
      lVar6 = GetPredictionCostCrossColorBlue
                        (argb_00,xsize,iVar7,iVar11,prev_x,prev_y,uVar3,iVar12,
                         accumulated_blue_histo);
      if (iVar4 <= lVar6) {
        lVar6 = iVar4;
        iVar12 = iVar10;
        uVar3 = uVar15;
      }
      uVar15 = uVar3;
      iVar10 = iVar12;
      iVar4 = lVar6;
      bVar16 = uVar14 < 7;
      uVar14 = uVar14 + 1;
    } while ((uVar9 != 4 || 0x18 < quality) && bVar16);
    if ((uVar9 - 4 < 3) && (iVar10 == 0 && uVar15 == 0)) break;
    if ((quality < 0x19) || (uVar9 = uVar9 + 1, (ulong)(0x32 < (uint)quality) * 3 + 4 <= uVar9))
    goto LAB_00149252;
  }
  iVar10 = 0;
  uVar15 = 0;
LAB_00149252:
  local_40 = (byte)iVar8;
  return (VP8LMultipliers)
         ((uint3)local_40 | (uint3)((uVar15 & 0xff) << 8) | (uint3)(iVar10 << 0x10));
}

Assistant:

static VP8LMultipliers GetBestColorTransformForTile(
    int tile_x, int tile_y, int bits, VP8LMultipliers prev_x,
    VP8LMultipliers prev_y, int quality, int xsize, int ysize,
    const uint32_t accumulated_red_histo[256],
    const uint32_t accumulated_blue_histo[256], const uint32_t* const argb) {
  const int max_tile_size = 1 << bits;
  const int tile_y_offset = tile_y * max_tile_size;
  const int tile_x_offset = tile_x * max_tile_size;
  const int all_x_max = GetMin(tile_x_offset + max_tile_size, xsize);
  const int all_y_max = GetMin(tile_y_offset + max_tile_size, ysize);
  const int tile_width = all_x_max - tile_x_offset;
  const int tile_height = all_y_max - tile_y_offset;
  const uint32_t* const tile_argb = argb + tile_y_offset * xsize
                                  + tile_x_offset;
  VP8LMultipliers best_tx;
  MultipliersClear(&best_tx);

  GetBestGreenToRed(tile_argb, xsize, tile_width, tile_height,
                    prev_x, prev_y, quality, accumulated_red_histo, &best_tx);
  GetBestGreenRedToBlue(tile_argb, xsize, tile_width, tile_height,
                        prev_x, prev_y, quality, accumulated_blue_histo,
                        &best_tx);
  return best_tx;
}